

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O1

string * __thiscall
Liby::http::Reply::toString_abi_cxx11_(string *__return_storage_ptr__,Reply *this)

{
  Buffer *this_00;
  uint uVar1;
  bool bVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  mapped_type *this_01;
  char *pcVar5;
  ulong uVar6;
  uint __len;
  ulong __val;
  __node_base *p_Var7;
  string __str;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  key_type local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"HTTP/1.1 ","");
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&status_number_abi_cxx11_,&this->status_);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(pmVar3->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&status_string_abi_cxx11_,&this->status_);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(pmVar3->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  this_00 = &this->content_;
  bVar2 = Buffer::empty(this_00);
  if (!bVar2) {
    uVar4 = Buffer::size(this_00);
    __val = -uVar4;
    if (0 < (long)uVar4) {
      __val = uVar4;
    }
    __len = 1;
    if (9 < __val) {
      uVar6 = __val;
      uVar1 = 4;
      do {
        __len = uVar1;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_0011a5c3;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_0011a5c3;
        }
        if (uVar6 < 10000) goto LAB_0011a5c3;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar1 = __len + 4;
      } while (bVar2);
      __len = __len + 1;
    }
LAB_0011a5c3:
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)((long)uVar4 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_70[0] + -((long)uVar4 >> 0x3f),__len,__val);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Content-Length","");
    this_01 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->headers_,&local_50);
    std::__cxx11::string::operator=((string *)this_01,(string *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  p_Var7 = &(this->headers_)._M_h._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var7[1]._M_nxt);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var7[5]._M_nxt);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  bVar2 = Buffer::empty(this_00);
  if (!bVar2) {
    pcVar5 = Buffer::data(this_00);
    Buffer::data(this_00);
    Buffer::size(this_00);
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
               (ulong)pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Reply::toString() {
    std::string ret = "HTTP/1.1 ";
    ret += status_number[status_];
    ret += " ";
    ret += status_string[status_];
    ret += "\r\n";
    if (!content_.empty()) {
        headers_["Content-Length"] = std::to_string(content_.size());
    }
    for (auto &header : headers_) {
        ret += header.first;
        ret += ": ";
        ret += header.second;
        ret += "\r\n";
    }
    ret += "\r\n";
    if (!content_.empty()) {
        ret.append(content_.data(), content_.data() + content_.size());
    }
    return ret;
}